

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_Env<Js::OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  RegSlot RVar1;
  FrameDisplay *aValue;
  
  RVar1 = FunctionBody::GetLocalFrameDisplayRegister(*(FunctionBody **)(this + 0x88));
  if (RVar1 == 0xffffffff) {
    aValue = *(FrameDisplay **)(*(long *)(this + 0x80) + 0x30);
  }
  else {
    aValue = GetLocalFrameDisplay(this);
  }
  SetOut(this,playout->Arg,aValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_Env(const unaligned T * playout)
    {
        Var argEnv;
        if (this->m_functionBody->GetLocalFrameDisplayRegister() != Constants::NoRegister)
        {
            argEnv = this->GetLocalFrameDisplay();
        }
        else
        {
            argEnv = this->LdEnv();
        }
        SetOut(playout->Arg, argEnv);
    }